

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool google::protobuf::anon_unknown_24::RetrieveOptions
               (int depth,Message *options,DescriptorPool *pool,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *option_entries)

{
  char *pcVar1;
  bool bVar2;
  Descriptor *type;
  Message *this;
  MessageLite *this_00;
  LogMessage *this_01;
  MessageLite *options_00;
  Metadata MVar3;
  string_view name;
  string_view v;
  string serialized;
  DynamicMessageFactory factory;
  LogMessage local_f0;
  string local_e0;
  DynamicMessageFactory local_c0;
  CodedInputStream local_80;
  
  MVar3 = Message::GetMetadata(options);
  if ((MVar3.descriptor)->file_->pool_ != pool) {
    MVar3 = Message::GetMetadata(options);
    pcVar1 = ((MVar3.descriptor)->all_names_).payload_;
    name._M_len = (ulong)*(ushort *)(pcVar1 + 2);
    name._M_str = pcVar1 + ~name._M_len;
    type = DescriptorPool::FindMessageTypeByName(pool,name);
    if (type != (Descriptor *)0x0) {
      DynamicMessageFactory::DynamicMessageFactory(&local_c0);
      this = DynamicMessageFactory::GetPrototype(&local_c0,type);
      this_00 = &Message::New(this)->super_MessageLite;
      MessageLite::SerializeAsString_abi_cxx11_(&local_e0,&options->super_MessageLite);
      local_80.buffer_ = (uint8_t *)local_e0._M_dataplus._M_p;
      local_80.buffer_end_ = (uint8_t *)(local_e0._M_dataplus._M_p + (int)local_e0._M_string_length)
      ;
      local_80.input_ = (ZeroCopyInputStream *)0x0;
      local_80._28_7_ = 0;
      local_80._35_4_ = 0;
      local_80.buffer_size_after_limit_ = 0;
      local_80.total_bytes_limit_ = 0x7fffffff;
      local_80.recursion_budget_ = io::CodedInputStream::default_recursion_limit_;
      local_80.recursion_limit_ = io::CodedInputStream::default_recursion_limit_;
      local_80.extension_pool_ = pool;
      local_80.extension_factory_ = &local_c0.super_MessageFactory;
      bVar2 = MessageLite::ParseFromCodedStream(this_00,&local_80);
      options_00 = this_00;
      if (!bVar2) {
        absl::lts_20250127::log_internal::LogMessage::LogMessage
                  (&local_f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0xdbc);
        this_01 = absl::lts_20250127::log_internal::LogMessage::operator<<
                            (&local_f0,(char (*) [38])"Found invalid proto option data for: ");
        MVar3 = Message::GetMetadata(options);
        pcVar1 = ((MVar3.descriptor)->all_names_).payload_;
        v._M_len = (ulong)*(ushort *)(pcVar1 + 2);
        v._M_str = pcVar1 + ~v._M_len;
        absl::lts_20250127::log_internal::LogMessage::operator<<(this_01,v);
        absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_f0);
        options_00 = &options->super_MessageLite;
      }
      bVar2 = RetrieveOptionsAssumingRightPool(depth,(Message *)options_00,option_entries);
      io::CodedInputStream::~CodedInputStream(&local_80);
      std::__cxx11::string::~string((string *)&local_e0);
      (*this_00->_vptr_MessageLite[1])(this_00);
      DynamicMessageFactory::~DynamicMessageFactory(&local_c0);
      return bVar2;
    }
  }
  bVar2 = RetrieveOptionsAssumingRightPool(depth,options,option_entries);
  return bVar2;
}

Assistant:

bool RetrieveOptions(int depth, const Message& options,
                     const DescriptorPool* pool,
                     std::vector<std::string>* option_entries) {
  // When printing custom options for a descriptor, we must use an options
  // message built on top of the same DescriptorPool where the descriptor
  // is coming from. This is to ensure we are interpreting custom options
  // against the right pool.
  if (options.GetDescriptor()->file()->pool() == pool) {
    return RetrieveOptionsAssumingRightPool(depth, options, option_entries);
  } else {
    const Descriptor* option_descriptor =
        pool->FindMessageTypeByName(options.GetDescriptor()->full_name());
    if (option_descriptor == nullptr) {
      // descriptor.proto is not in the pool. This means no custom options are
      // used so we are safe to proceed with the compiled options message type.
      return RetrieveOptionsAssumingRightPool(depth, options, option_entries);
    }
    DynamicMessageFactory factory;
    std::unique_ptr<Message> dynamic_options(
        factory.GetPrototype(option_descriptor)->New());
    std::string serialized = options.SerializeAsString();
    io::CodedInputStream input(
        reinterpret_cast<const uint8_t*>(serialized.data()), serialized.size());
    input.SetExtensionRegistry(pool, &factory);
    if (dynamic_options->ParseFromCodedStream(&input)) {
      return RetrieveOptionsAssumingRightPool(depth, *dynamic_options,
                                              option_entries);
    } else {
      ABSL_LOG(ERROR) << "Found invalid proto option data for: "
                      << options.GetDescriptor()->full_name();
      return RetrieveOptionsAssumingRightPool(depth, options, option_entries);
    }
  }
}